

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

bool __thiscall BaseIndex::StartBackgroundSync(BaseIndex *this)

{
  pointer pcVar1;
  long *plVar2;
  logic_error *this_00;
  long in_FS_OFFSET;
  thread local_28;
  long *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_init)._M_base._M_i & 1U) == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Error: Cannot start a non-initialized index");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  else {
    local_28._M_id._M_thread = (id)0;
    plVar2 = (long *)operator_new(0x38);
    *plVar2 = (long)&PTR___State_impl_013db890;
    plVar2[1] = (long)this;
    plVar2[2] = (long)(plVar2 + 4);
    pcVar1 = (this->m_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(plVar2 + 2),pcVar1,pcVar1 + (this->m_name)._M_string_length);
    plVar2[6] = (long)util::TraceThread;
    local_20 = plVar2;
    std::thread::_M_start_thread(&local_28,&local_20,0);
    if (local_20 != (long *)0x0) {
      (**(code **)(*local_20 + 8))();
    }
    if ((this->m_thread_sync)._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->m_thread_sync)._M_id._M_thread = (native_handle_type)local_28._M_id._M_thread;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return true;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool BaseIndex::StartBackgroundSync()
{
    if (!m_init) throw std::logic_error("Error: Cannot start a non-initialized index");

    m_thread_sync = std::thread(&util::TraceThread, GetName(), [this] { Sync(); });
    return true;
}